

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizes
          (FileDescriptorProto *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  string *psVar3;
  char *data;
  void *pvVar4;
  Type *pTVar5;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  int *piVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output);
  }
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    internal::WireFormatLite::WriteStringMaybeAliased(2,(this->package_).ptr_,output);
  }
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    this_00 = &this->dependency_;
    iVar7 = 0;
    do {
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      data = (pTVar5->_M_dataplus)._M_p;
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::VerifyUtf8String
                (data,(int)pTVar5->_M_string_length,SERIALIZE,
                 "google.protobuf.FileDescriptorProto.dependency");
      pTVar5 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::WriteString(3,pTVar5,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                        (&(this->message_type_).super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                           (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_00,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value_01 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                           (&(this->service_).super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)value_01,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar7 = 0;
    do {
      value_02 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                           (&(this->extension_).super_RepeatedPtrFieldBase,iVar7);
      internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_02,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((uVar1 & 8) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)this->options_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray
              (9,(MessageLite *)this->source_code_info_,output);
  }
  iVar2 = (this->public_dependency_).current_size_;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      piVar6 = RepeatedField<int>::Get(&this->public_dependency_,iVar7);
      internal::WireFormatLite::WriteInt32(10,*piVar6,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  iVar2 = (this->weak_dependency_).current_size_;
  if (0 < iVar2) {
    iVar7 = 0;
    do {
      piVar6 = RepeatedField<int>::Get(&this->weak_dependency_,iVar7);
      internal::WireFormatLite::WriteInt32(0xb,*piVar6,output);
      iVar7 = iVar7 + 1;
    } while (iVar2 != iVar7);
  }
  if ((uVar1 & 4) != 0) {
    psVar3 = (this->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    internal::WireFormatLite::WriteStringMaybeAliased(0xc,(this->syntax_).ptr_,output);
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return;
  }
  internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void FileDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->package(), output);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->dependency(i), output);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->message_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->enum_type(i), output);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->service(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->extension(i), output);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, *this->options_, output);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, *this->source_code_info_, output);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->public_dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      10, this->public_dependency(i), output);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->weak_dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      11, this->weak_dependency(i), output);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->syntax(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FileDescriptorProto)
}